

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RefCountedObjectImpl.hpp
# Opt level: O3

SwapChainVkImpl * __thiscall
Diligent::MakeNewRCObj<Diligent::SwapChainVkImpl,Diligent::IMemoryAllocator>::operator()
          (MakeNewRCObj<Diligent::SwapChainVkImpl,Diligent::IMemoryAllocator> *this,
          SwapChainDesc *CtorArgs,RenderDeviceVkImpl **CtorArgs_1,DeviceContextVkImpl **CtorArgs_2,
          LinuxNativeWindow *CtorArgs_3)

{
  undefined8 *puVar1;
  RefCountersImpl *pRefCounters;
  RefCountersImpl *this_00;
  SwapChainVkImpl *this_01;
  
  if (*(long **)(this + 8) == (long *)0x0) {
    this_00 = (RefCountersImpl *)operator_new(0x30);
    (this_00->super_IReferenceCounters)._vptr_IReferenceCounters =
         (_func_int **)&PTR_AddStrongRef_0091b8e8;
    (this_00->m_ObjectState)._M_i = NotInitialized;
    this_00->m_ObjectWrapperBuffer[0] = 0;
    this_00->m_ObjectWrapperBuffer[1] = 0;
    this_00->m_ObjectWrapperBuffer[2] = 0;
    this_00->m_NumStrongReferences = (__atomic_base<int>)0x0;
    this_00->m_NumWeakReferences = (__atomic_base<int>)0x0;
    (this_00->m_Lock).m_IsLocked._M_base._M_i = false;
    pRefCounters = this_00;
  }
  else {
    pRefCounters = (RefCountersImpl *)(**(code **)(**(long **)(this + 8) + 0x18))();
    this_00 = (RefCountersImpl *)0x0;
  }
  puVar1 = *(undefined8 **)this;
  if (puVar1 == (undefined8 *)0x0) {
    this_01 = (SwapChainVkImpl *)malloc(0x168);
    SwapChainVkImpl::SwapChainVkImpl
              (this_01,&pRefCounters->super_IReferenceCounters,CtorArgs,*CtorArgs_1,*CtorArgs_2,
               CtorArgs_3);
  }
  else {
    this_01 = (SwapChainVkImpl *)
              (**(code **)*puVar1)
                        (puVar1,0x168,*(undefined8 *)(this + 0x10),*(undefined8 *)(this + 0x18),
                         *(undefined4 *)(this + 0x20));
    SwapChainVkImpl::SwapChainVkImpl
              (this_01,&pRefCounters->super_IReferenceCounters,CtorArgs,*CtorArgs_1,*CtorArgs_2,
               CtorArgs_3);
  }
  if (this_00 != (RefCountersImpl *)0x0) {
    RefCountersImpl::Attach<Diligent::SwapChainVkImpl,Diligent::IMemoryAllocator>
              (this_00,this_01,*(IMemoryAllocator **)this);
  }
  return this_01;
}

Assistant:

ObjectType* operator()(CtorArgTypes&&... CtorArgs)
    {
        RefCountersImpl*    pNewRefCounters = nullptr;
        IReferenceCounters* pRefCounters    = nullptr;
        if (m_pOwner != nullptr)
            pRefCounters = m_pOwner->GetReferenceCounters();
        else
        {
            // Constructor of RefCountersImpl class is private and only accessible
            // by methods of MakeNewRCObj
            pNewRefCounters = new RefCountersImpl{};
            pRefCounters    = pNewRefCounters;
        }
        ObjectType* pObj = nullptr;
        try
        {
#ifndef DILIGENT_DEVELOPMENT
            static constexpr const char* m_dvpDescription = "<Unavailable in release build>";
            static constexpr const char* m_dvpFileName    = "<Unavailable in release build>";
            static constexpr Int32       m_dvpLineNumber  = -1;
#endif
            // Operators new and delete of RefCountedObject are private and only accessible
            // by methods of MakeNewRCObj
            if (m_pAllocator)
                pObj = new (*m_pAllocator, m_dvpDescription, m_dvpFileName, m_dvpLineNumber) ObjectType{pRefCounters, std::forward<CtorArgTypes>(CtorArgs)...};
            else
                pObj = new ObjectType{pRefCounters, std::forward<CtorArgTypes>(CtorArgs)...};
            if (pNewRefCounters != nullptr)
                pNewRefCounters->Attach<ObjectType, AllocatorType>(pObj, m_pAllocator);
        }
        catch (...)
        {
            if (pNewRefCounters != nullptr)
                pNewRefCounters->SelfDestroy();
            throw;
        }
        return pObj;
    }